

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O2

void __thiscall CWire::Enumerate(CWire *this,int iMode)

{
  short sVar1;
  uint uVar2;
  CDesign *this_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  CLayer *pCVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int local_128;
  CPoint MidPoint;
  CPoint MidPoint2;
  _Vector_base<CSegment_*,_std::allocator<CSegment_*>_> local_a8;
  _Vector_base<CSegment_*,_std::allocator<CSegment_*>_> local_90;
  _Vector_base<CSegment_*,_std::allocator<CSegment_*>_> local_78;
  _Vector_base<CSegment_*,_std::allocator<CSegment_*>_> local_60;
  _Vector_base<CSegment_*,_std::allocator<CSegment_*>_> local_48;
  
  this_00 = CObject::m_pDesign;
  iVar13 = (int)(CObject::m_pDesign->super_CBBox).m_cMaxZ;
  iVar14 = (int)(CObject::m_pDesign->super_CBBox).m_cMinZ;
  iVar3 = GetDirection(this);
  uVar2 = (this->super_CObject).m_iProp;
  if ((uVar2 >> 9 & 1) == 0) {
    iVar12 = iVar13 - iVar14;
    if ((uVar2 & 0xf) == 0) {
      if ((iMode & 1U) != 0) {
        CPoint::CPoint(&MidPoint);
        CPoint::Initialize(&MidPoint,(int)this->m_pPointS->m_iX,(int)this->m_pPointE->m_iY,
                           (int)this->m_pPointS->m_cZ,(CWire *)0x0);
        iVar4 = CPoint::GetDirection(this->m_pPointS,&MidPoint);
        CPoint::SetZ(&MidPoint,(int)this->m_pPointE->m_cZ);
        iVar5 = CPoint::GetDirection(&MidPoint,this->m_pPointE);
        for (iVar3 = 1; iVar3 <= iVar12; iVar3 = iVar3 + 1) {
          pCVar11 = CDesign::GetLayer(this_00,iVar3);
          iVar6 = CLayer::GetDirection(pCVar11);
          if (iVar6 == iVar4) {
            for (iVar6 = 1; (iVar14 - iVar13) + iVar6 != 1; iVar6 = iVar6 + 1) {
              pCVar11 = CDesign::GetLayer(this_00,iVar6);
              iVar7 = CLayer::GetDirection(pCVar11);
              if (iVar7 == iVar5) {
                Bend((vector<CSegment_*,_std::allocator<CSegment_*>_> *)&local_60,this,&MidPoint,
                     iVar3,iVar6);
                std::
                vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                ::push_back(&this->m_SegmentList,(value_type *)&local_60);
                std::_Vector_base<CSegment_*,_std::allocator<CSegment_*>_>::~_Vector_base(&local_60)
                ;
              }
            }
          }
        }
        CPoint::Initialize(&MidPoint,(int)this->m_pPointE->m_iX,(int)this->m_pPointS->m_iY,
                           (int)this->m_pPointS->m_cZ,(CWire *)0x0);
        iVar4 = CPoint::GetDirection(this->m_pPointS,&MidPoint);
        CPoint::SetZ(&MidPoint,(int)this->m_pPointE->m_cZ);
        iVar5 = CPoint::GetDirection(&MidPoint,this->m_pPointE);
        for (iVar3 = 1; iVar3 <= iVar12; iVar3 = iVar3 + 1) {
          pCVar11 = CDesign::GetLayer(this_00,iVar3);
          iVar6 = CLayer::GetDirection(pCVar11);
          if (iVar6 == iVar4) {
            for (iVar6 = 1; (iVar14 - iVar13) + iVar6 != 1; iVar6 = iVar6 + 1) {
              pCVar11 = CDesign::GetLayer(this_00,iVar6);
              iVar7 = CLayer::GetDirection(pCVar11);
              if (iVar7 == iVar5) {
                Bend((vector<CSegment_*,_std::allocator<CSegment_*>_> *)&local_78,this,&MidPoint,
                     iVar3,iVar6);
                std::
                vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                ::push_back(&this->m_SegmentList,(value_type *)&local_78);
                std::_Vector_base<CSegment_*,_std::allocator<CSegment_*>_>::~_Vector_base(&local_78)
                ;
              }
            }
          }
        }
        CPoint::~CPoint(&MidPoint);
      }
      if ((iMode & 2U) != 0) {
        CPoint::CPoint(&MidPoint);
        CPoint::CPoint(&MidPoint2);
        local_128 = (int)this->m_pPointS->m_iX;
        sVar1 = this->m_pPointE->m_iX;
        while( true ) {
          local_128 = local_128 + 1;
          iVar3 = (int)this->m_pPointS->m_iY;
          if (sVar1 <= local_128) break;
          CPoint::Initialize(&MidPoint,local_128,iVar3,(int)this->m_pPointS->m_cZ,(CWire *)0x0);
          CPoint::Initialize(&MidPoint2,local_128,(int)this->m_pPointE->m_iY,
                             (int)this->m_pPointS->m_cZ,(CWire *)0x0);
          iVar4 = CPoint::GetDirection(this->m_pPointS,&MidPoint);
          iVar5 = CPoint::GetDirection(&MidPoint,&MidPoint2);
          CPoint::SetZ(&MidPoint2,(int)this->m_pPointE->m_cZ);
          iVar6 = CPoint::GetDirection(&MidPoint2,this->m_pPointE);
          for (iVar3 = 1; iVar3 <= iVar12; iVar3 = iVar3 + 1) {
            pCVar11 = CDesign::GetLayer(this_00,iVar3);
            iVar7 = CLayer::GetDirection(pCVar11);
            if (iVar7 == iVar4) {
              for (iVar7 = 1; iVar7 != iVar12 + 1; iVar7 = iVar7 + 1) {
                pCVar11 = CDesign::GetLayer(this_00,iVar7);
                iVar8 = CLayer::GetDirection(pCVar11);
                if (iVar8 == iVar5) {
                  for (iVar8 = 1; (iVar14 - iVar13) + iVar8 != 1; iVar8 = iVar8 + 1) {
                    pCVar11 = CDesign::GetLayer(this_00,iVar8);
                    iVar9 = CLayer::GetDirection(pCVar11);
                    if (iVar9 == iVar6) {
                      Bend((vector<CSegment_*,_std::allocator<CSegment_*>_> *)&local_90,this,
                           &MidPoint,&MidPoint2,iVar3,iVar7,iVar8);
                      std::
                      vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                      ::push_back(&this->m_SegmentList,(value_type *)&local_90);
                      std::_Vector_base<CSegment_*,_std::allocator<CSegment_*>_>::~_Vector_base
                                (&local_90);
                    }
                  }
                }
              }
            }
          }
        }
        iVar4 = (int)this->m_pPointE->m_iY;
        local_128 = iVar4;
        if (iVar3 < iVar4) {
          local_128 = iVar3;
        }
        if (iVar4 < iVar3) {
          iVar4 = iVar3;
        }
        while (local_128 = local_128 + 1, local_128 < iVar4) {
          CPoint::Initialize(&MidPoint,(int)this->m_pPointS->m_iX,local_128,
                             (int)this->m_pPointS->m_cZ,(CWire *)0x0);
          CPoint::Initialize(&MidPoint2,(int)this->m_pPointE->m_iX,local_128,
                             (int)this->m_pPointS->m_cZ,(CWire *)0x0);
          iVar5 = CPoint::GetDirection(this->m_pPointS,&MidPoint);
          iVar6 = CPoint::GetDirection(&MidPoint,&MidPoint2);
          CPoint::SetZ(&MidPoint2,(int)this->m_pPointE->m_cZ);
          iVar7 = CPoint::GetDirection(&MidPoint2,this->m_pPointE);
          for (iVar3 = 1; iVar3 <= iVar12; iVar3 = iVar3 + 1) {
            pCVar11 = CDesign::GetLayer(this_00,iVar3);
            iVar8 = CLayer::GetDirection(pCVar11);
            if (iVar8 == iVar5) {
              for (iVar8 = 1; iVar8 != iVar12 + 1; iVar8 = iVar8 + 1) {
                pCVar11 = CDesign::GetLayer(this_00,iVar8);
                iVar9 = CLayer::GetDirection(pCVar11);
                if (iVar9 == iVar6) {
                  for (iVar9 = 1; (iVar14 - iVar13) + iVar9 != 1; iVar9 = iVar9 + 1) {
                    pCVar11 = CDesign::GetLayer(this_00,iVar9);
                    iVar10 = CLayer::GetDirection(pCVar11);
                    if (iVar10 == iVar7) {
                      Bend((vector<CSegment_*,_std::allocator<CSegment_*>_> *)&local_a8,this,
                           &MidPoint,&MidPoint2,iVar3,iVar8,iVar9);
                      std::
                      vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                      ::push_back(&this->m_SegmentList,(value_type *)&local_a8);
                      std::_Vector_base<CSegment_*,_std::allocator<CSegment_*>_>::~_Vector_base
                                (&local_a8);
                    }
                  }
                }
              }
            }
          }
        }
        CPoint::~CPoint(&MidPoint2);
        CPoint::~CPoint(&MidPoint);
      }
    }
    else {
      for (iVar13 = 1; iVar13 <= iVar12; iVar13 = iVar13 + 1) {
        pCVar11 = CDesign::GetLayer(this_00,iVar13);
        iVar14 = CLayer::GetDirection(pCVar11);
        if (iVar14 == iVar3) {
          Bend((vector<CSegment_*,_std::allocator<CSegment_*>_> *)&local_48,this,iVar13);
          std::
          vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
          ::push_back(&this->m_SegmentList,(value_type *)&local_48);
          std::_Vector_base<CSegment_*,_std::allocator<CSegment_*>_>::~_Vector_base(&local_48);
        }
      }
    }
  }
  return;
}

Assistant:

void CWire::Enumerate(int iMode)
{
	CDesign*	pDesign		=	GetDesign();
	int			iNumLayer	=	pDesign->T();
	int			iDirection	=	GetDirection();
	int			i,j,k;

	if(IsPoint())
	{
		
	}
	else if(IsFlat())
	{
		for (i=1;i<=iNumLayer;++i)
		{
			if(pDesign->GetLayer(i)->GetDirection()==iDirection)
			{	
				AddSegmentList(Bend(i));
			}
		}
	}
	else
	{
		//////////////////////////////////////////////////////////////////////////
		// L-shape routing [6/19/2006 thyeros]
		//////////////////////////////////////////////////////////////////////////
		if(iMode&ENUM_MODE_L)
		{
			int	i1stElbowDir	=	DIR_DIAGONAL;
			int	i2ndElbowDir	=	DIR_DIAGONAL;
			
			CPoint	MidPoint;
			
			MidPoint.Initialize(m_pPointS->X(),m_pPointE->Y(),m_pPointS->Z(),NULL);			
			i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint);
			MidPoint.SetZ(m_pPointE->Z());
			i2ndElbowDir	=	MidPoint.GetDirection(m_pPointE);
			
			for (i=LAYER_METAL1;i<=iNumLayer;++i)
			{
				if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
				{				
					for (j=LAYER_METAL1;j<=iNumLayer;++j)
					{
						if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
						{
							AddSegmentList(Bend(&MidPoint,i,j));	
						}
					}
				}
			}
			
			MidPoint.Initialize(m_pPointE->X(),m_pPointS->Y(),m_pPointS->Z(),NULL);
			i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint);
			MidPoint.SetZ(m_pPointE->Z());
			i2ndElbowDir	=	MidPoint.GetDirection(m_pPointE);
			
			for (i=LAYER_METAL1;i<=iNumLayer;++i)
			{
				if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
				{				
					for (j=LAYER_METAL1;j<=iNumLayer;++j)
					{
						if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
						{
							AddSegmentList(Bend(&MidPoint,i,j));	
						}
					}
				}
			}

			//// minimum via enumeration [2/9/2007 thyeros]
			//for (i=LAYER_METAL1;i<=iNumLayer;++i)
			//{
			//	if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
			//	{				
			//		int	iLayerBelow	=	i-1;
			//		int	iLayerAbove	=	i+1;

			//		if(iLayerBelow>=LAYER_METAL1&&pDesign->GetLayer(iLayerBelow)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerBelow));	
			//		if(iLayerAbove<=iNumLayer&&pDesign->GetLayer(iLayerAbove)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerAbove));	
			//	}
			//}
			//
			//MidPoint.Initialize(m_pPointE->X(),m_pPointS->Y(),m_pPointS->Z(),NULL);
			//i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint);
			//MidPoint.SetZ(m_pPointE->Z());
			//i2ndElbowDir	=	MidPoint.GetDirection(m_pPointE);
			//
			//for (i=LAYER_METAL1;i<=iNumLayer;++i)
			//{
			//	if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
			//	{				
			//		int	iLayerBelow	=	i-1;
			//		int	iLayerAbove	=	i+1;

			//		if(iLayerBelow>=LAYER_METAL1&&pDesign->GetLayer(iLayerBelow)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerBelow));	
			//		if(iLayerAbove<=iNumLayer&&pDesign->GetLayer(iLayerAbove)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerAbove));	
			//	}
			//}
		}
		
		//////////////////////////////////////////////////////////////////////////
		// Z-shape routing [6/19/2006 thyeros]
		//////////////////////////////////////////////////////////////////////////
		if(iMode&ENUM_MODE_Z)
		{
			int	i1stElbowDir	=	DIR_DIAGONAL;
			int	i2ndElbowDir	=	DIR_DIAGONAL;
			int	i3rdElbowDir	=	DIR_DIAGONAL;
			
			CPoint	MidPoint1,MidPoint2;
			
			// slide X [9/6/2006 thyeros]
			int	iMinX	=	m_pPointS->X();
			int	iMaxX	=	m_pPointE->X();

			for (int iX=iMinX+1;iX<iMaxX;iX++)
			{
				MidPoint1.Initialize(iX,m_pPointS->Y(),m_pPointS->Z(),NULL);
				MidPoint2.Initialize(iX,m_pPointE->Y(),m_pPointS->Z(),NULL);
				
				i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint1);
				i2ndElbowDir	=	MidPoint1.GetDirection(&MidPoint2);
				MidPoint2.SetZ(m_pPointE->Z());
				i3rdElbowDir	=	MidPoint2.GetDirection(m_pPointE);

				for (i=LAYER_METAL1;i<=iNumLayer;++i)
				{
					if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
					{				
						for (j=LAYER_METAL1;j<=iNumLayer;++j)
						{
							if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
							{
								for (k=LAYER_METAL1;k<=iNumLayer;k++)
								{
									if(pDesign->GetLayer(k)->GetDirection()==i3rdElbowDir)
									{
										AddSegmentList(Bend(&MidPoint1,&MidPoint2,i,j,k));	
									}
								}
							}
						}
					}
				}
			}

			// slide Y [9/6/2006 thyeros]
			int	iMinY	=	MIN(m_pPointS->Y(),m_pPointE->Y());
			int	iMaxY	=	MAX(m_pPointS->Y(),m_pPointE->Y());

			for (int iY=iMinY+1;iY<iMaxY;iY++)
			{
				MidPoint1.Initialize(m_pPointS->X(),iY,m_pPointS->Z(),NULL);
				MidPoint2.Initialize(m_pPointE->X(),iY,m_pPointS->Z(),NULL);
				
				i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint1);
				i2ndElbowDir	=	MidPoint1.GetDirection(&MidPoint2);
				MidPoint2.SetZ(m_pPointE->Z());
				i3rdElbowDir	=	MidPoint2.GetDirection(m_pPointE);

				for (i=LAYER_METAL1;i<=iNumLayer;++i)
				{
					if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
					{				
						for (j=LAYER_METAL1;j<=iNumLayer;++j)
						{
							if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
							{
								for (k=LAYER_METAL1;k<=iNumLayer;k++)
								{
									if(pDesign->GetLayer(k)->GetDirection()==i3rdElbowDir)
									{
										AddSegmentList(Bend(&MidPoint1,&MidPoint2,i,j,k));	
									}
								}
							}
						}
					}
				}
			}
		}
	}
}